

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O1

void tcg_context_init_x86_64(TCGContext *s)

{
  char **ppcVar1;
  TCGTemp **ppTVar2;
  TCGArgConstraint *pTVar3;
  byte bVar4;
  int iVar5;
  TCGOpDef *pTVar6;
  gpointer pvVar7;
  gpointer pvVar8;
  GHashTable *hash_table;
  GHashTable *pGVar9;
  int *piVar10;
  jit_code_entry *pjVar11;
  long lVar12;
  undefined1 *puVar13;
  ushort uVar14;
  uint uVar15;
  ushort uVar16;
  _Bool _Var17;
  ushort uVar18;
  ulong uVar19;
  byte *pbVar20;
  byte *pbVar21;
  TCGOpcode op;
  bool bVar22;
  uint in_XCR0;
  
  uVar15 = 0;
  memset(s,0,0xa750);
  pTVar6 = (TCGOpDef *)g_malloc0(0x1720);
  s->tcg_op_defs = pTVar6;
  memcpy(pTVar6,tcg_op_defs_org,0x1720);
  lVar12 = 9;
  do {
    uVar15 = (uint)*(byte *)((long)s->tcg_op_defs + lVar12 + -1) +
             *(byte *)((long)&s->tcg_op_defs->name + lVar12) + uVar15;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0x1729);
  pvVar7 = g_malloc0((ulong)uVar15 * 8);
  pvVar8 = g_malloc0((ulong)uVar15 << 2);
  pTVar6 = s->tcg_op_defs;
  lVar12 = 0;
  do {
    *(gpointer *)((long)&pTVar6->args_ct + lVar12) = pvVar7;
    *(gpointer *)((long)&pTVar6->sorted_args + lVar12) = pvVar8;
    uVar19 = (ulong)((uint)(&pTVar6->nb_oargs)[lVar12] + (uint)(&pTVar6->nb_iargs)[lVar12]);
    pvVar8 = (gpointer)((long)pvVar8 + uVar19 * 4);
    pvVar7 = (gpointer)((long)pvVar7 + uVar19 * 8);
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0x1720);
  lVar12 = 0;
  hash_table = g_hash_table_new((GHashFunc)0x0,(GEqualFunc)0x0);
  s->helper_table = hash_table;
  pGVar9 = g_hash_table_new_full
                     ((GHashFunc)0x0,(GEqualFunc)0x0,(GDestroyNotify)0x0,uc_free_inline_hook_info);
  s->custom_helper_infos = pGVar9;
  do {
    g_hash_table_insert(hash_table,*(gpointer *)((long)&all_helpers[0].func + lVar12),
                        (gpointer)((long)&all_helpers[0].func + lVar12));
    lVar12 = lVar12 + 0x18;
  } while (lVar12 != 0x49b0);
  _Var17 = false;
  piVar10 = (int *)cpuid_basic_info(0);
  if (6 < *piVar10) {
    lVar12 = cpuid_Extended_Feature_Enumeration_info(7);
    bVar4 = (byte)*(undefined4 *)(lVar12 + 4);
    have_bmi1_x86_64 = (_Bool)(bVar4 >> 3 & 1);
    have_bmi2 = (_Bool)((byte)((uint)*(undefined4 *)(lVar12 + 4) >> 8) & 1);
    _Var17 = (_Bool)(bVar4 >> 5 & 1);
  }
  if (0 < *piVar10) {
    lVar12 = cpuid_Version_info(1);
    uVar15 = *(uint *)(lVar12 + 0xc);
    have_movbe = (_Bool)((byte)(uVar15 >> 0x16) & 1);
    have_popcnt_x86_64 = (_Bool)((byte)(uVar15 >> 0x17) & 1);
    if (((uVar15 >> 0x1b & 1) != 0) && ((~in_XCR0 & 6) == 0)) {
      have_avx1_x86_64 = (_Bool)((byte)(uVar15 >> 0x1c) & 1);
      have_avx2_x86_64 = _Var17;
    }
  }
  piVar10 = (int *)cpuid(0x8000000);
  if (0 < *piVar10) {
    lVar12 = cpuid(0x80000001);
    have_lzcnt = (_Bool)((byte)*(undefined4 *)(lVar12 + 0xc) >> 5 & 1);
  }
  s->tcg_target_available_regs[0] = 0xffff;
  s->tcg_target_available_regs[1] = 0xffff;
  if (have_avx1_x86_64 == true) {
    s->tcg_target_available_regs[2] = 0xffff0000;
    s->tcg_target_available_regs[3] = 0xffff0000;
  }
  if (have_avx2_x86_64 == true) {
    s->tcg_target_available_regs[4] = 0xffff0000;
  }
  s->tcg_target_call_clobber_regs = 0xffff0fc7;
  s->reserved_regs = 0x10;
  lVar12 = 0;
  do {
    bVar4 = s->tcg_op_defs[lVar12].flags;
    if ((bVar4 & 0x20) != 0) goto LAB_004f0eb0;
    pTVar6 = s->tcg_op_defs + lVar12;
    iVar5 = (uint)pTVar6->nb_oargs + (uint)pTVar6->nb_iargs;
    if (iVar5 == 0) goto LAB_004f0eb0;
    puVar13 = tcg_target_op_def_r;
    switch((uint)lVar12 & 0xff) {
    case 7:
    case 0x41:
      puVar13 = tcg_target_op_def_setc;
      break;
    case 8:
    case 0x42:
      puVar13 = tcg_target_op_def_movc;
      break;
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0x23:
    case 0x24:
    case 0x30:
    case 0x32:
    case 0x3e:
    case 0x43:
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x49:
    case 0x60:
    case 99:
    case 100:
    case 0x65:
    case 0x69:
    case 0x6a:
    case 0x6c:
    case 0x6d:
    case 0x7a:
      puVar13 = tcg_target_op_def_r_r;
      break;
    case 0xe:
    case 0x4a:
      puVar13 = tcg_target_op_def_qi_r;
      break;
    case 0xf:
    case 0x10:
    case 0x4b:
    case 0x4c:
      puVar13 = tcg_target_op_def_ri_r;
      break;
    case 0x11:
    case 0x4e:
      puVar13 = tcg_target_op_def_r_r_re;
      break;
    case 0x12:
    case 0x13:
    case 0x1b:
    case 0x1c:
    case 0x4f:
    case 0x50:
    case 0x58:
    case 0x59:
      puVar13 = tcg_target_op_def_r_0_re;
      break;
    default:
      puVar13 = (undefined1 *)0x0;
      break;
    case 0x18:
    case 0x19:
    case 0x55:
    case 0x56:
      puVar13 = tcg_target_op_def_div2;
      break;
    case 0x1a:
    case 0x57:
      puVar13 = tcg_target_op_def_and;
      break;
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x5a:
    case 0x5b:
    case 0x5c:
      puVar13 = tcg_target_op_def_r_0_ci;
      if (have_bmi2 != false) {
        puVar13 = tcg_target_op_def_r_r_ri;
      }
      break;
    case 0x20:
    case 0x21:
    case 0x5d:
    case 0x5e:
      puVar13 = tcg_target_op_def_r_0_ci;
      break;
    case 0x22:
    case 0x5f:
      puVar13 = tcg_target_op_def_dep;
      break;
    case 0x25:
    case 0x62:
      puVar13 = tcg_target_op_def_r_0_r;
      break;
    case 0x26:
    case 0x67:
      puVar13 = tcg_target_op_def_r_re;
      break;
    case 0x27:
    case 0x28:
    case 0x7b:
    case 0x7c:
      puVar13 = tcg_target_op_def_arith2;
      break;
    case 0x29:
    case 0x2a:
    case 0x7d:
    case 0x7e:
      puVar13 = tcg_target_op_def_mul2;
      break;
    case 0x2d:
      puVar13 = tcg_target_op_def_b2;
      break;
    case 0x2e:
      puVar13 = tcg_target_op_def_s2;
      break;
    case 0x2f:
    case 0x31:
    case 0x68:
    case 0x6b:
      puVar13 = tcg_target_op_def_r_q;
      break;
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x66:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
      puVar13 = tcg_target_op_def_r_0;
      break;
    case 0x37:
    case 0x73:
      puVar13 = tcg_target_op_def_andc;
      break;
    case 0x3c:
    case 0x78:
      uVar15 = (uint)have_lzcnt * 0x88;
      puVar13 = tcg_target_op_def_clz;
      goto LAB_004f0bbe;
    case 0x3d:
    case 0x79:
      uVar15 = (uint)have_bmi1_x86_64 * 0x80 + (uint)have_bmi1_x86_64 * 8;
      puVar13 = tcg_target_op_def_ctz;
LAB_004f0bbe:
      puVar13 = puVar13 + uVar15;
      break;
    case 0x4d:
      puVar13 = tcg_target_op_def_re_r;
      break;
    case 0x84:
      break;
    case 0x85:
    case 0x87:
      puVar13 = tcg_target_op_def_r_L;
      break;
    case 0x86:
    case 0x88:
      puVar13 = tcg_target_op_def_L_L;
      break;
    case 0x8b:
    case 0x94:
    case 0xa3:
    case 0xa4:
    case 0xa5:
    case 0xb5:
      puVar13 = tcg_target_op_def_x_x;
      break;
    case 0x8d:
    case 0x8e:
    case 0x8f:
      puVar13 = tcg_target_op_def_x_r;
      break;
    case 0x90:
    case 0x91:
    case 0x92:
    case 0x95:
    case 0x96:
    case 0x97:
    case 0x98:
    case 0x99:
    case 0x9a:
    case 0x9b:
    case 0x9c:
    case 0x9d:
    case 0x9e:
    case 0x9f:
    case 0xa0:
    case 0xa6:
    case 0xa7:
    case 0xa8:
    case 0xa9:
    case 0xaa:
    case 0xab:
    case 0xac:
    case 0xb0:
    case 0xb2:
    case 0xb3:
    case 0xb4:
    case 0xb6:
    case 0xb7:
    case 0xb8:
      puVar13 = tcg_target_op_def_x_x_x;
      break;
    case 0xb1:
      puVar13 = tcg_target_op_def_x_x_x_x;
    }
    bVar22 = (bVar4 & 0x10) == 0;
    uVar14 = 0x400;
    if (bVar22) {
      uVar14 = 2;
    }
    uVar16 = 0x200;
    if (bVar22) {
      uVar16 = 2;
    }
    uVar18 = 0x100;
    if (bVar22) {
      uVar18 = 2;
    }
    uVar19 = 0;
    do {
      pbVar20 = *(byte **)(puVar13 + uVar19 * 8 + 8);
      pTVar6->args_ct[uVar19].u.regs = 0;
      pTVar6->args_ct[uVar19].ct = 0;
      while( true ) {
        while( true ) {
          while( true ) {
            for (; bVar4 = *pbVar20, bVar4 - 0x30 < 10; pbVar20 = pbVar20 + 1) {
              pTVar6->args_ct[uVar19] = pTVar6->args_ct[(long)(char)bVar4 + -0x30];
              pTVar3 = pTVar6->args_ct;
              pTVar3[(long)(char)bVar4 + -0x30].ct = pTVar3[(long)(char)bVar4 + -0x30].ct | 0x80;
              pTVar3[(long)(char)bVar4 + -0x30].alias_index = (uint8_t)uVar19;
              *(byte *)&pTVar3[uVar19].ct = (byte)pTVar3[uVar19].ct | 0x40;
              pTVar3[uVar19].alias_index = bVar4 - 0x30;
            }
            if (bVar4 != 0x26) break;
            pTVar6->args_ct[uVar19].ct = pTVar6->args_ct[uVar19].ct | 0x20;
            pbVar20 = pbVar20 + 1;
          }
          if (bVar4 != 0x69) break;
          pTVar6->args_ct[uVar19].ct = pTVar6->args_ct[uVar19].ct | 2;
          pbVar20 = pbVar20 + 1;
        }
        if (bVar4 == 0) break;
        pTVar3 = pTVar6->args_ct;
        pbVar21 = pbVar20 + 1;
        pbVar20 = pbVar21;
        if (bVar4 < 0x51) {
          if (bVar4 == 0x44) {
            *(byte *)&pTVar3[uVar19].ct = (byte)pTVar3[uVar19].ct | 1;
            *(byte *)&pTVar3[uVar19].u = *(byte *)&pTVar3[uVar19].u | 0x80;
          }
          else if (bVar4 == 0x49) {
            pTVar3[uVar19].ct = pTVar3[uVar19].ct | uVar14;
          }
          else {
            pbVar20 = (byte *)0x0;
            if (bVar4 == 0x4c) {
              *(byte *)&pTVar3[uVar19].ct = (byte)pTVar3[uVar19].ct | 1;
              pTVar3[uVar19].u.regs = 0xff3f;
              pbVar20 = pbVar21;
            }
          }
        }
        else if (bVar4 < 0x71) {
          pbVar20 = (byte *)0x0;
          switch(bVar4) {
          case 0x51:
            *(byte *)&pTVar3[uVar19].ct = (byte)pTVar3[uVar19].ct | 1;
            pTVar3[uVar19].u.regs = 0xf;
            pbVar20 = pbVar21;
            break;
          case 0x53:
            *(byte *)&pTVar3[uVar19].ct = (byte)pTVar3[uVar19].ct | 1;
            *(byte *)&pTVar3[uVar19].u = *(byte *)&pTVar3[uVar19].u | 0x40;
            pbVar20 = pbVar21;
            break;
          case 0x57:
            pbVar20 = (byte *)((long)&pTVar3[uVar19].ct + 1);
            *pbVar20 = *pbVar20 | 8;
            pbVar20 = pbVar21;
            break;
          case 0x5a:
            pTVar3[uVar19].ct = pTVar3[uVar19].ct | uVar16;
            pbVar20 = pbVar21;
            break;
          case 0x61:
            *(byte *)&pTVar3[uVar19].ct = (byte)pTVar3[uVar19].ct | 1;
            *(byte *)&pTVar3[uVar19].u = *(byte *)&pTVar3[uVar19].u | 1;
            pbVar20 = pbVar21;
            break;
          case 0x62:
            *(byte *)&pTVar3[uVar19].ct = (byte)pTVar3[uVar19].ct | 1;
            *(byte *)&pTVar3[uVar19].u = *(byte *)&pTVar3[uVar19].u | 8;
            pbVar20 = pbVar21;
            break;
          case 99:
            *(byte *)&pTVar3[uVar19].ct = (byte)pTVar3[uVar19].ct | 1;
            *(byte *)&pTVar3[uVar19].u = *(byte *)&pTVar3[uVar19].u | 2;
            pbVar20 = pbVar21;
            break;
          case 100:
            *(byte *)&pTVar3[uVar19].ct = (byte)pTVar3[uVar19].ct | 1;
            *(byte *)&pTVar3[uVar19].u = *(byte *)&pTVar3[uVar19].u | 4;
            pbVar20 = pbVar21;
            break;
          case 0x65:
            pTVar3[uVar19].ct = pTVar3[uVar19].ct | uVar18;
            pbVar20 = pbVar21;
          }
        }
        else if (bVar4 == 0x71) {
          *(byte *)&pTVar3[uVar19].ct = (byte)pTVar3[uVar19].ct | 1;
          pTVar3[uVar19].u.regs = 0xffff;
        }
        else if (bVar4 == 0x72) {
          *(byte *)&pTVar3[uVar19].ct = (byte)pTVar3[uVar19].ct | 1;
          pTVar3[uVar19].u.regs = pTVar3[uVar19].u.regs | 0xffff;
        }
        else {
          pbVar20 = (byte *)0x0;
          if (bVar4 == 0x78) {
            *(byte *)&pTVar3[uVar19].ct = (byte)pTVar3[uVar19].ct | 1;
            pTVar3[uVar19].u.regs = pTVar3[uVar19].u.regs | 0xffff0000;
            pbVar20 = pbVar21;
          }
        }
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != iVar5 + (uint)(iVar5 == 0));
    sort_constraints(pTVar6,0,(uint)pTVar6->nb_oargs);
    sort_constraints(pTVar6,(uint)pTVar6->nb_oargs,(uint)pTVar6->nb_iargs);
LAB_004f0eb0:
    lVar12 = lVar12 + 1;
    if (lVar12 == 0xb9) {
      piVar10 = (int *)g_malloc(0x7c);
      s->indirect_reg_alloc_order = piVar10;
      lVar12 = 0x1e;
      do {
        *piVar10 = tcg_target_reg_alloc_order[lVar12];
        piVar10 = piVar10 + 1;
        bVar22 = lVar12 != 0;
        lVar12 = lVar12 + -1;
      } while (bVar22);
      pjVar11 = (jit_code_entry *)g_malloc(0x20);
      s->one_entry = pjVar11;
      pjVar11->symfile_addr = (void *)0x0;
      uVar19 = (ulong)(uint)s->nb_temps;
      s->nb_globals = s->nb_globals + 1;
      s->nb_temps = s->nb_temps + 1;
      *(undefined8 *)(s->temps + uVar19) = 0;
      s->temps[uVar19].val = 0;
      ppcVar1 = &s->temps[uVar19].name;
      *ppcVar1 = (char *)0x0;
      ppcVar1[1] = (char *)0x0;
      s->temps[uVar19].state_ptr = (void *)0x0;
      ppTVar2 = &s->temps[uVar19].mem_base;
      *ppTVar2 = (TCGTemp *)0x0;
      ppTVar2[1] = (TCGTemp *)0x0;
      *(undefined8 *)(s->temps + uVar19) = 0x2101010005;
      s->temps[uVar19].name = "env";
      *(byte *)&s->reserved_regs = (byte)s->reserved_regs | 0x20;
      s->cpu_env = (TCGv_ptr)(uVar19 * 0x38 + 0x388);
      return;
    }
  } while( true );
}

Assistant:

void tcg_context_init(TCGContext *s)
{
    int op, total_args, n, i;
    TCGOpDef *def;
    TCGArgConstraint *args_ct;
    int *sorted_args;
    TCGTemp *ts;
    GHashTable *helper_table;

    memset(s, 0, sizeof(*s));
    s->nb_globals = 0;

    // copy original tcg_op_defs_org for private usage
    s->tcg_op_defs = g_malloc0(sizeof(tcg_op_defs_org));
    memcpy(s->tcg_op_defs, tcg_op_defs_org, sizeof(tcg_op_defs_org));

    /* Count total number of arguments and allocate the corresponding
       space */
    total_args = 0;
    for(op = 0; op < NB_OPS; op++) {
        def = &s->tcg_op_defs[op];
        n = def->nb_iargs + def->nb_oargs;
        total_args += n;
    }

    args_ct = g_malloc0(sizeof(TCGArgConstraint) * total_args);
    sorted_args = g_malloc0(sizeof(int) * total_args);

    for(op = 0; op < NB_OPS; op++) {
        def = &s->tcg_op_defs[op];
        def->args_ct = args_ct;
        def->sorted_args = sorted_args;
        n = def->nb_iargs + def->nb_oargs;
        sorted_args += n;
        args_ct += n;
    }

    /* Register helpers.  */
    /* Use g_direct_hash/equal for direct pointer comparisons on func.  */
    helper_table = g_hash_table_new(NULL, NULL);
    s->helper_table = helper_table;

    // Unicorn: Store our custom inline hooks infomation
    s->custom_helper_infos = g_hash_table_new_full(NULL, NULL, NULL, uc_free_inline_hook_info);

    for (i = 0; i < ARRAY_SIZE(all_helpers); ++i) {
        g_hash_table_insert(helper_table, (gpointer)all_helpers[i].func,
                            (gpointer)&all_helpers[i]);
    }

    tcg_target_init(s);
    process_op_defs(s);

    /* Reverse the order of the saved registers, assuming they're all at
       the start of tcg_target_reg_alloc_order.  */
    for (n = 0; n < ARRAY_SIZE(tcg_target_reg_alloc_order); ++n) {
        int r = tcg_target_reg_alloc_order[n];
        if (tcg_regset_test_reg(s->tcg_target_call_clobber_regs, r)) {
            break;
        }
    }
    n = ARRAY_SIZE(tcg_target_reg_alloc_order);
    s->indirect_reg_alloc_order = g_malloc(sizeof(int) * n);
    for (i = 0; i < n; ++i) {
        s->indirect_reg_alloc_order[i] = tcg_target_reg_alloc_order[n - 1 - i];
    }
    for (; i < ARRAY_SIZE(tcg_target_reg_alloc_order); ++i) {
        s->indirect_reg_alloc_order[i] = tcg_target_reg_alloc_order[i];
    }

    s->one_entry = g_malloc(sizeof(struct jit_code_entry));
    s->one_entry->symfile_addr = NULL;

    tcg_debug_assert(!tcg_regset_test_reg(s->reserved_regs, TCG_AREG0));
    ts = tcg_global_reg_new_internal(s, TCG_TYPE_PTR, TCG_AREG0, "env");
    s->cpu_env = temp_tcgv_ptr(s, ts);
}